

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

boolean bite_monster(monst *mon)

{
  int iVar1;
  
  iVar1 = monsndx(mon->data);
  if (iVar1 - 0x144U < 3) {
    pline("Unfortunately, eating any of it is fatal.");
    done_in_by(mon);
    return '\x01';
  }
  if (iVar1 == 0xd7) {
    if ((youmonst.data != mons + 0xd7 &&
        (youmonst.data != mons + 0xa0 && youmonst.data != mons + 0x73)) &&
        (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0)) {
      pline("You don\'t feel very well.");
      u.uprops[0x3a].intrinsic = 10;
    }
  }
  else if (iVar1 == 0x154) {
    if (u.uprops[0x21].intrinsic == 0) {
      return '\0';
    }
    goto LAB_0018a7c1;
  }
  if ((mon->data->mflags1 & 0x8000000) == 0) {
    return '\0';
  }
  if (u.uprops[0x21].intrinsic == 0) {
    return '\0';
  }
LAB_0018a7c1:
  fix_petrification();
  return '\0';
}

Assistant:

boolean bite_monster(struct monst *mon)
{
	switch(monsndx(mon->data)) {
	    case PM_LIZARD:
		if (Stoned) fix_petrification();
		break;
	    case PM_DEATH:
	    case PM_PESTILENCE:
	    case PM_FAMINE:
		pline("Unfortunately, eating any of it is fatal.");
		done_in_by(mon);
		return TRUE;	/* lifesaved */

	    case PM_GREEN_SLIME:
		if (!Unchanging && youmonst.data != &mons[PM_FIRE_VORTEX] &&
				   youmonst.data != &mons[PM_FIRE_ELEMENTAL] &&
				   youmonst.data != &mons[PM_GREEN_SLIME]) {
		    pline("You don't feel very well.");
		    Slimed = 10L;
		}
		/* Fall through */
	    default:
		if (acidic(mon->data) && Stoned)
		    fix_petrification();
		break;
	}
	return FALSE;
}